

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O2

size_t __thiscall charls_jpegls_encoder::estimated_destination_size(charls_jpegls_encoder *this)

{
  charls::check_operation((this->frame_info_).width != 0);
  return ((long)((this->frame_info_).bits_per_sample + 7) / 8 & 0xffffffffU) *
         (long)(this->frame_info_).component_count *
         (ulong)(this->frame_info_).height * (ulong)(this->frame_info_).width + 0x422;
}

Assistant:

size_t estimated_destination_size() const
    {
        check_operation(is_frame_info_configured());
        return checked_mul(checked_mul(checked_mul(frame_info_.width, frame_info_.height), frame_info_.component_count),
                           bit_to_byte_count(frame_info_.bits_per_sample)) +
               1024 + spiff_header_size_in_bytes;
    }